

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::
InOutFuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::buildTest(InOutFuncCase<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *this)

{
  deInt32 *pdVar1;
  long *plVar2;
  int *piVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  SharedPtrStateBase *pSVar5;
  ExprP<tcu::Matrix<float,_2,_3>_> expr;
  Variable<tcu::Matrix<float,_2,_3>_> *local_68;
  SharedPtrStateBase *local_60;
  string local_58;
  Variables<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_2,_3>_>_>
  *local_38;
  
  paVar4 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"out0","");
  variable<tcu::Matrix<float,2,3>>((shaderexecutor *)&local_68,&local_58);
  pSVar5 = (this->m_variables).out0.
           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state;
  if (pSVar5 != local_60) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar5->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_variables).out0.
        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr =
             (Variable<tcu::Matrix<float,_2,_3>_> *)0x0;
        (*((this->m_variables).out0.
           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state)
          ->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar5 = (this->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                 m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_variables).out0.
        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state =
             (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_variables).out0.
    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr =
         local_68;
    (this->m_variables).out0.
    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state =
         local_60;
    if (local_60 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_60->strongRefCount = local_60->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_60->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68 = (Variable<tcu::Matrix<float,_2,_3>_> *)0x0;
      (*local_60->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_60->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_60 != (SharedPtrStateBase *)0x0) {
        (*local_60->_vptr_SharedPtrStateBase[1])();
      }
      local_60 = (SharedPtrStateBase *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"out1","");
  variable<tcu::Matrix<float,2,3>>((shaderexecutor *)&local_68,&local_58);
  pSVar5 = (this->m_variables).out1.
           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state;
  if (pSVar5 != local_60) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar5->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_variables).out1.
        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr =
             (Variable<tcu::Matrix<float,_2,_3>_> *)0x0;
        (*((this->m_variables).out1.
           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state)
          ->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_variables).out1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar5 = (this->m_variables).out1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                 m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_variables).out1.
        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state =
             (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_variables).out1.
    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr =
         local_68;
    (this->m_variables).out1.
    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state =
         local_60;
    if (local_60 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_60->strongRefCount = local_60->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_variables).out1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_60->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68 = (Variable<tcu::Matrix<float,_2,_3>_> *)0x0;
      (*local_60->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_60->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_60 != (SharedPtrStateBase *)0x0) {
        (*local_60->_vptr_SharedPtrStateBase[1])();
      }
      local_60 = (SharedPtrStateBase *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"in0","");
  variable<tcu::Matrix<float,2,3>>((shaderexecutor *)&local_68,&local_58);
  pSVar5 = (this->m_variables).in0.
           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state;
  if (pSVar5 != local_60) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar5->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_variables).in0.
        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr =
             (Variable<tcu::Matrix<float,_2,_3>_> *)0x0;
        (*((this->m_variables).in0.
           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state)
          ->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar5 = (this->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                 m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_variables).in0.
        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state =
             (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_variables).in0.
    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr =
         local_68;
    (this->m_variables).in0.
    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_state =
         local_60;
    if (local_60 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_60->strongRefCount = local_60->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_60->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68 = (Variable<tcu::Matrix<float,_2,_3>_> *)0x0;
      (*local_60->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_60->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_60 != (SharedPtrStateBase *)0x0) {
        (*local_60->_vptr_SharedPtrStateBase[1])();
      }
      local_60 = (SharedPtrStateBase *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"in1","");
  variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_68,&local_58);
  pSVar5 = (this->m_variables).in1.
           super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state;
  if (pSVar5 != local_60) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar5->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_variables).in1.
        super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
             (Variable<vkt::shaderexecutor::Void> *)0x0;
        (*((this->m_variables).in1.
           super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state)
          ->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar5 = (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_variables).in1.
        super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state =
             (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_variables).in1.
    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
         (Variable<vkt::shaderexecutor::Void> *)local_68;
    (this->m_variables).in1.
    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state =
         local_60;
    if (local_60 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_60->strongRefCount = local_60->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_60->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68 = (Variable<tcu::Matrix<float,_2,_3>_> *)0x0;
      (*local_60->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_60->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_60 != (SharedPtrStateBase *)0x0) {
        (*local_60->_vptr_SharedPtrStateBase[1])();
      }
      local_60 = (SharedPtrStateBase *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"in2","");
  variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_68,&local_58);
  pSVar5 = (this->m_variables).in2.
           super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state;
  if (pSVar5 != local_60) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar5->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_variables).in2.
        super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
             (Variable<vkt::shaderexecutor::Void> *)0x0;
        (*((this->m_variables).in2.
           super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state)
          ->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar5 = (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_variables).in2.
        super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state =
             (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_variables).in2.
    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
         (Variable<vkt::shaderexecutor::Void> *)local_68;
    (this->m_variables).in2.
    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state =
         local_60;
    if (local_60 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_60->strongRefCount = local_60->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_60->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68 = (Variable<tcu::Matrix<float,_2,_3>_> *)0x0;
      (*local_60->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_60->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_60 != (SharedPtrStateBase *)0x0) {
        (*local_60->_vptr_SharedPtrStateBase[1])();
      }
      local_60 = (SharedPtrStateBase *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"in3","");
  variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_68,&local_58);
  pSVar5 = (this->m_variables).in3.
           super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state;
  if (pSVar5 != local_60) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar5->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_variables).in3.
        super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
             (Variable<vkt::shaderexecutor::Void> *)0x0;
        (*((this->m_variables).in3.
           super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state)
          ->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar5 = (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_variables).in3.
        super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state =
             (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_variables).in3.
    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
         (Variable<vkt::shaderexecutor::Void> *)local_68;
    (this->m_variables).in3.
    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state =
         local_60;
    if (local_60 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_60->strongRefCount = local_60->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_60->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68 = (Variable<tcu::Matrix<float,_2,_3>_> *)0x0;
      (*local_60->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_60->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_60 != (SharedPtrStateBase *)0x0) {
        (*local_60->_vptr_SharedPtrStateBase[1])();
      }
      local_60 = (SharedPtrStateBase *)0x0;
    }
  }
  local_38 = &this->m_variables;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  applyVar<vkt::shaderexecutor::Signature<tcu::Matrix<float,2,3>,tcu::Matrix<float,2,3>,tcu::Matrix<float,2,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            ((shaderexecutor *)&local_58,this->m_func,&local_38->in0,&(this->m_variables).out1,
             &(this->m_variables).in1,&(this->m_variables).in2);
  variableStatement<tcu::Matrix<float,2,3>>
            ((shaderexecutor *)&local_68,&(this->m_variables).out0,
             (ExprP<tcu::Matrix<float,_2,_3>_> *)&local_58,false);
  pSVar5 = (this->super_FuncCaseBase).m_stmt.super_SharedPtr<const_vkt::shaderexecutor::Statement>.
           m_state;
  if (pSVar5 != local_60) {
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar5->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->super_FuncCaseBase).m_stmt.super_SharedPtr<const_vkt::shaderexecutor::Statement>.
        m_ptr = (Statement *)0x0;
        (*((this->super_FuncCaseBase).m_stmt.super_SharedPtr<const_vkt::shaderexecutor::Statement>.
          m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->super_FuncCaseBase).m_stmt.
                 super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar5 = (this->super_FuncCaseBase).m_stmt.
                 super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state;
        if (pSVar5 != (SharedPtrStateBase *)0x0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])();
        }
        (this->super_FuncCaseBase).m_stmt.super_SharedPtr<const_vkt::shaderexecutor::Statement>.
        m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->super_FuncCaseBase).m_stmt.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr =
         (Statement *)local_68;
    (this->super_FuncCaseBase).m_stmt.super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state
         = local_60;
    if (local_60 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_60->strongRefCount = local_60->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->super_FuncCaseBase).m_stmt.
                 super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  if (local_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_60->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68 = (Variable<tcu::Matrix<float,_2,_3>_> *)0x0;
      (*local_60->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_60->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_60 != (SharedPtrStateBase *)0x0) {
        (*local_60->_vptr_SharedPtrStateBase[1])();
      }
      local_60 = (SharedPtrStateBase *)0x0;
    }
  }
  PrecisionCase::
  testStatement<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>,vkt::shaderexecutor::OutTypes<tcu::Matrix<float,2,3>,tcu::Matrix<float,2,3>>>
            ((PrecisionCase *)this,local_38,
             (this->super_FuncCaseBase).m_stmt.super_SharedPtr<const_vkt::shaderexecutor::Statement>
             .m_ptr);
  if ((long *)local_58._M_string_length != (long *)0x0) {
    LOCK();
    plVar2 = (long *)(local_58._M_string_length + 8);
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      local_58._M_dataplus._M_p = (pointer)0x0;
      (**(code **)(*(long *)local_58._M_string_length + 0x10))();
    }
    LOCK();
    piVar3 = (int *)(local_58._M_string_length + 0xc);
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if ((*piVar3 == 0) && ((long *)local_58._M_string_length != (long *)0x0)) {
      (**(code **)(*(long *)local_58._M_string_length + 8))();
    }
  }
  return;
}

Assistant:

void InOutFuncCase<Sig>::buildTest (void)
{

	m_variables.out0	= variable<Ret>("out0");
	m_variables.out1	= variable<Arg1>("out1");
	m_variables.in0		= variable<Arg0>("in0");
	m_variables.in1		= variable<Arg2>("in1");
	m_variables.in2		= variable<Arg3>("in2");
	m_variables.in3		= variable<Void>("in3");

	{
		ExprP<Ret> expr	= applyVar(m_func, m_variables.in0, m_variables.out1, m_variables.in1, m_variables.in2);
		m_stmt			= variableAssignment(m_variables.out0, expr);

		this->testStatement(m_variables, *m_stmt);
	}
}